

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

SRes LzmaEnc_CodeOneMemBlock
               (CLzmaEncHandle pp,Bool_conflict reInit,Byte *dest,size_t *destLen,
               UInt32 desiredPackSize,UInt32 *unpackSize)

{
  undefined8 uVar1;
  SRes SVar2;
  long *in_RCX;
  UInt32 in_ESI;
  long in_RDI;
  int *in_R9;
  CSeqOutStreamBuf outStream;
  SRes res;
  UInt64 nowPos64;
  CLzmaEnc *p;
  code *local_70 [2];
  long local_60;
  int local_58;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  long lVar3;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_70[0] = MyWrite;
  local_60 = *in_RCX;
  local_58 = 0;
  *(undefined4 *)(in_RDI + 0x84) = 0;
  *(undefined4 *)(in_RDI + 0x88) = 0;
  *(undefined4 *)(in_RDI + 0xb0) = 0;
  lVar3 = in_RDI;
  if (in_ESI != 0) {
    LzmaEnc_Init((CLzmaEnc *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  LzmaEnc_InitPrices((CLzmaEnc *)0x11977e);
  uVar1 = *(undefined8 *)(in_RDI + 0x98);
  RangeEnc_Init((CRangeEnc *)(in_RDI + 0xb8));
  *(code ***)(in_RDI + 0xe8) = local_70;
  SVar2 = LzmaEnc_CodeOneBlock
                    ((CLzmaEnc *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (Bool_conflict)((ulong)lVar3 >> 0x20),(UInt32)lVar3,in_ESI);
  *in_R9 = (int)*(undefined8 *)(in_RDI + 0x98) - (int)uVar1;
  *in_RCX = *in_RCX - local_60;
  if (local_58 != 0) {
    SVar2 = 7;
  }
  return SVar2;
}

Assistant:

SRes LzmaEnc_CodeOneMemBlock(CLzmaEncHandle pp, Bool reInit,
    Byte *dest, size_t *destLen, UInt32 desiredPackSize, UInt32 *unpackSize)
{
  CLzmaEnc *p = (CLzmaEnc *)pp;
  UInt64 nowPos64;
  SRes res;
  CSeqOutStreamBuf outStream;

  outStream.funcTable.Write = MyWrite;
  outStream.data = dest;
  outStream.rem = *destLen;
  outStream.overflow = False;

  p->writeEndMark = False;
  p->finished = False;
  p->result = SZ_OK;

  if (reInit)
    LzmaEnc_Init(p);
  LzmaEnc_InitPrices(p);
  nowPos64 = p->nowPos64;
  RangeEnc_Init(&p->rc);
  p->rc.outStream = &outStream.funcTable;

  res = LzmaEnc_CodeOneBlock(p, True, desiredPackSize, *unpackSize);
  
  *unpackSize = (UInt32)(p->nowPos64 - nowPos64);
  *destLen -= outStream.rem;
  if (outStream.overflow)
    return SZ_ERROR_OUTPUT_EOF;

  return res;
}